

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

string * __thiscall
wabt::Decompile_abi_cxx11_
          (string *__return_storage_ptr__,wabt *this,Module *module,DecompileOptions *options)

{
  Decompiler decompiler;
  Decompiler local_88;
  
  local_88.lst.vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88.lst.vars._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88.mc.current_func_ = (Func *)0x0;
  local_88.mc.label_stack_.super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.mc.label_stack_.super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.mc.label_stack_.super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.indent_amount = 2;
  local_88.target_exp_width = 0x46;
  local_88.lst.vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88.lst.vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88.cur_func = (Func *)0x0;
  local_88.cur_ast = (AST *)0x0;
  local_88.lst.vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88.mc.module = (Module *)this;
  local_88.options = (DecompileOptions *)module;
  local_88.lst.vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88.lst.vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Decompiler::Decompile_abi_cxx11_(__return_storage_ptr__,&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
              *)&local_88.lst,
             (_Link_type)local_88.lst.vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::vector<wabt::Label,_std::allocator<wabt::Label>_>::~vector(&local_88.mc.label_stack_);
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile(const Module& module, const DecompileOptions& options) {
  Decompiler decompiler(module, options);
  return decompiler.Decompile();
}